

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O0

void __thiscall sockpp::unix_address::unix_address(unix_address *this,string *path)

{
  ulong uVar1;
  system_error *this_00;
  long lVar2;
  unsigned_long *puVar3;
  void *__src;
  error_code eVar4;
  unsigned_long local_48;
  size_t local_40;
  size_t n;
  uint local_28;
  error_category *local_20;
  string *local_18;
  string *path_local;
  unix_address *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  sock_address::sock_address(&this->super_sock_address);
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__unix_address_00119ce0;
  (this->addr_).sun_family = 0;
  memset((this->addr_).sun_path,0,0x6c);
  uVar1 = std::__cxx11::string::length();
  if (0x6c < uVar1) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    eVar4 = std::make_error_code(invalid_argument);
    local_28 = eVar4._M_value;
    eVar4._4_4_ = 0;
    eVar4._M_value = local_28;
    local_20 = eVar4._M_cat;
    std::system_error::system_error(this_00,eVar4);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  (this->addr_).sun_family = 1;
  lVar2 = std::__cxx11::string::length();
  local_48 = lVar2 + 1;
  puVar3 = std::min<unsigned_long>(&local_48,&MAX_PATH_NAME);
  local_40 = *puVar3;
  __src = (void *)std::__cxx11::string::c_str();
  memcpy((this->addr_).sun_path,__src,local_40);
  return;
}

Assistant:

unix_address::unix_address(const string& path) {
    if (path.length() > MAX_PATH_NAME)
        throw system_error{make_error_code(errc::invalid_argument)};

    addr_.sun_family = ADDRESS_FAMILY;
    // Remember, if len==MAX, there's no NUL terminator
    const size_t n = std::min(path.length() + 1, MAX_PATH_NAME);
    std::memcpy(addr_.sun_path, path.c_str(), n);
}